

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void copy_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  if (nIn < 1) {
    uVar4 = 0;
    uVar6 = 10;
  }
  else {
    uVar4 = 0;
    bVar3 = false;
    do {
      bVar1 = zIn[uVar4];
      bVar2 = bVar3;
      if ((byte)(bVar1 - 0x30) < 10) {
        bVar2 = true;
      }
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        bVar1 = bVar1 | 0x20;
        bVar2 = bVar3;
      }
      zOut[uVar4] = bVar1;
      uVar4 = uVar4 + 1;
      bVar3 = bVar2;
    } while ((uint)nIn != uVar4);
    uVar6 = 3;
    if (!bVar2) {
      uVar6 = 10;
    }
  }
  if ((int)(uVar6 * 2) < nIn) {
    lVar5 = (long)(int)(nIn - uVar6);
    uVar4 = (ulong)uVar6;
    do {
      zOut[uVar4] = zOut[lVar5];
      lVar5 = lVar5 + 1;
      uVar4 = uVar4 + 1;
    } while (lVar5 < nIn);
  }
  zOut[(int)uVar4] = '\0';
  *pnOut = (int)uVar4;
  return;
}

Assistant:

static void copy_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, mx, j;
  int hasDigit = 0;
  for(i=0; i<nIn; i++){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zOut[i] = c - 'A' + 'a';
    }else{
      if( c>='0' && c<='9' ) hasDigit = 1;
      zOut[i] = c;
    }
  }
  mx = hasDigit ? 3 : 10;
  if( nIn>mx*2 ){
    for(j=mx, i=nIn-mx; i<nIn; i++, j++){
      zOut[j] = zOut[i];
    }
    i = j;
  }
  zOut[i] = 0;
  *pnOut = i;
}